

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O1

string * __thiscall
t_php_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  _func_int *p_Var4;
  long lVar5;
  long lVar6;
  size_t __n;
  int iVar7;
  t_const_value_type tVar8;
  t_type *ptVar9;
  ostream *poVar10;
  undefined4 extraout_var;
  t_type *ptVar11;
  int64_t iVar12;
  _Rb_tree_header *p_Var13;
  _Base_ptr p_Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  long *plVar15;
  size_type *psVar16;
  _func_int **pp_Var17;
  t_php_generator *this_00;
  pointer pptVar18;
  char *pcVar19;
  t_type *type_00;
  bool bVar20;
  undefined1 auVar21 [12];
  ostringstream out;
  string local_220;
  t_php_generator *local_200;
  t_type *local_1f8;
  string *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  local_200 = this;
  local_1f0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  ptVar9 = t_type::get_true_type(type);
  iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[5])();
  if ((char)iVar7 == '\0') {
    iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[10])();
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xb])();
      if (((char)iVar7 == '\0') &&
         (iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xc])(), (char)iVar7 == '\0')) {
        iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0x10])();
        if ((char)iVar7 == '\0') {
          iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xe])();
          if (((char)iVar7 != '\0') ||
             (iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xf])(), (char)iVar7 != '\0')) {
            (*(ptVar9->super_t_doc)._vptr_t_doc[0xe])();
            ptVar11 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"array(",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
            piVar1 = &(local_200->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + 1;
            pptVar18 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar18 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              do {
                t_generator::indent_abi_cxx11_(&local_220,(t_generator *)local_200);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                           local_220._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                render_const_value_abi_cxx11_(&local_220,local_200,ptVar11,*pptVar18);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                           local_220._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xf])();
                if ((char)iVar7 != '\0') {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," => true",8);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                pptVar18 = pptVar18 + 1;
              } while (pptVar18 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
            piVar1 = &(local_200->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + -1;
            poVar10 = t_generator::indent((t_generator *)local_200,(ostream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          }
        }
        else {
          local_1f8 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
          ptVar9 = *(t_type **)&ptVar9[1].annotations_._M_t._M_impl;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"array(",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          piVar1 = &(local_200->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          p_Var14 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var13 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var14 != p_Var13) {
            paVar2 = &local_220.field_2;
            do {
              t_generator::indent_abi_cxx11_(&local_220,(t_generator *)local_200);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              render_const_value_abi_cxx11_
                        (&local_220,local_200,local_1f8,*(t_const_value **)(p_Var14 + 1));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," => ",4);
              render_const_value_abi_cxx11_
                        (&local_220,local_200,ptVar9,(t_const_value *)p_Var14[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
            } while ((_Rb_tree_header *)p_Var14 != p_Var13);
          }
          piVar1 = &(local_200->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar10 = t_generator::indent((t_generator *)local_200,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"new ",4);
        php_namespace_abi_cxx11_(&local_220,local_200,ptVar9->program_);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                             local_220._M_string_length);
        iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])();
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,*(char **)CONCAT44(extraout_var,iVar7),
                             ((undefined8 *)CONCAT44(extraout_var,iVar7))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(array(",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        paVar2 = &local_220.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        piVar1 = &(local_200->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        ptVar11 = (t_type *)(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_1f8 = (t_type *)&(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        this_00 = local_200;
        if (ptVar11 != local_1f8) {
          do {
            pp_Var17 = ptVar9[1].super_t_doc._vptr_t_doc;
            if (pp_Var17 == (_func_int **)ptVar9[1].super_t_doc.doc_._M_dataplus._M_p) {
              type_00 = (t_type *)0x0;
            }
            else {
              type_00 = (t_type *)0x0;
              do {
                p_Var4 = *pp_Var17;
                lVar5 = *(long *)((long)&(ptVar11->super_t_doc).doc_.field_2 + 8);
                lVar6 = *(long *)(lVar5 + 0x48);
                local_220._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_220,lVar6,*(long *)(lVar5 + 0x50) + lVar6);
                __n = *(size_t *)(p_Var4 + 0x70);
                if (__n == local_220._M_string_length) {
                  if (__n == 0) {
                    bVar20 = true;
                  }
                  else {
                    iVar7 = bcmp(*(void **)(p_Var4 + 0x68),local_220._M_dataplus._M_p,__n);
                    bVar20 = iVar7 == 0;
                  }
                }
                else {
                  bVar20 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != paVar2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                if (bVar20) {
                  type_00 = *(t_type **)(*pp_Var17 + 0x60);
                }
                pp_Var17 = pp_Var17 + 1;
              } while (pp_Var17 != (_func_int **)ptVar9[1].super_t_doc.doc_._M_dataplus._M_p);
            }
            this_00 = local_200;
            if (type_00 == (t_type *)0x0) {
              __return_storage_ptr___00 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
              iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_1c8,"type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar7));
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_1c8);
              local_220._M_dataplus._M_p = (pointer)*plVar15;
              psVar16 = (size_type *)(plVar15 + 2);
              if ((size_type *)local_220._M_dataplus._M_p == psVar16) {
                local_220.field_2._M_allocated_capacity = *psVar16;
                local_220.field_2._8_4_ = (undefined4)plVar15[3];
                local_220.field_2._12_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
                local_220._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_220.field_2._M_allocated_capacity = *psVar16;
              }
              local_220._M_string_length = plVar15[1];
              *plVar15 = (long)psVar16;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              lVar5 = *(long *)((long)&(ptVar11->super_t_doc).doc_.field_2 + 8);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              lVar6 = *(long *)(lVar5 + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1e8,lVar6,*(long *)(lVar5 + 0x50) + lVar6);
              std::operator+(__return_storage_ptr___00,&local_220,&local_1e8);
              __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                          std::__cxx11::string::~string);
            }
            t_generator::indent_abi_cxx11_(&local_220,(t_generator *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            render_const_value_abi_cxx11_
                      (&local_220,this_00,g_type_string,
                       *(t_const_value **)((long)&(ptVar11->super_t_doc).doc_.field_2 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," => ",4);
            render_const_value_abi_cxx11_
                      (&local_220,this_00,type_00,
                       *(t_const_value **)&(ptVar11->super_t_doc).has_doc_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
            ptVar11 = (t_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar11);
          } while (ptVar11 != local_1f8);
        }
        piVar1 = &(this_00->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar10 = t_generator::indent((t_generator *)this_00,(ostream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"))",2);
      }
    }
    else {
      poVar10 = t_generator::indent((t_generator *)local_200,(ostream *)local_1a8);
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)poVar10);
    }
  }
  else {
    uVar3 = *(uint *)&ptVar9[1].super_t_doc._vptr_t_doc;
    switch(uVar3) {
    case 1:
      local_220._M_dataplus._M_p._0_1_ = 0x22;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)&local_220,1);
      t_generator::get_escaped_string_abi_cxx11_(&local_220,(t_generator *)local_200,value);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
      local_1c8._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_1c8,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      break;
    case 2:
      iVar12 = t_const_value::get_integer(value);
      pcVar19 = "false";
      if (0 < iVar12) {
        pcVar19 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar19,(ulong)(0 < iVar12) ^ 5);
      break;
    case 7:
      tVar8 = t_const_value::get_type(value);
      if (tVar8 != CV_INTEGER) {
        std::ostream::_M_insert<double>(value->doubleVal_);
        break;
      }
    case 3:
    case 4:
    case 5:
    case 6:
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)local_1a8);
      break;
    default:
      auVar21 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_220,(t_base_type *)(ulong)uVar3,auVar21._8_4_);
      std::operator+(auVar21._0_8_,"compiler error: no const of base type ",&local_220);
      __cxa_throw(auVar21._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_1f0;
}

Assistant:

string t_php_generator::render_const_value(t_type* type, t_const_value* value) {
  std::ostringstream out;
  type = get_true_type(type);
  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    indent(out) << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << "new " << php_namespace(type->get_program()) << type->get_name() << "(array(" << endl;
    indent_up();
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      out << indent();
      out << render_const_value(g_type_string, v_iter->first);
      out << " => ";
      out << render_const_value(field_type, v_iter->second);
      out << "," << endl;
    }
    indent_down();
    indent(out) << "))";
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    out << "array(" << endl;
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent();
      out << render_const_value(ktype, v_iter->first);
      out << " => ";
      out << render_const_value(vtype, v_iter->second);
      out << "," << endl;
    }
    indent_down();
    indent(out) << ")";
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    out << "array(" << endl;
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent();
      out << render_const_value(etype, *v_iter);
      if (type->is_set()) {
        out << " => true";
      }
      out << "," << endl;
    }
    indent_down();
    indent(out) << ")";
  }
  return out.str();
}